

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple_management.hpp
# Opt level: O2

void burst::management::manage<burst::dynamic_tuple>
               (operation_t todo,void *source,void *destination)

{
  uint __line;
  
  switch(todo) {
  case copy:
    dynamic_tuple::dynamic_tuple((dynamic_tuple *)destination,(dynamic_tuple *)source);
    return;
  case move:
    dynamic_tuple::dynamic_tuple((dynamic_tuple *)destination,(dynamic_tuple *)source);
    return;
  case destroy:
    if (source == (void *)0x0) {
      dynamic_tuple::~dynamic_tuple((dynamic_tuple *)destination);
      return;
    }
    __line = 0x56;
    break;
  case size:
    if (source == (void *)0x0) {
      *(undefined8 *)destination = 0x30;
      return;
    }
    __line = 0x5c;
    break;
  case type:
    if (source == (void *)0x0) {
      *(pointer_____offset_0x10___ **)destination = &dynamic_tuple::typeinfo;
      return;
    }
    __line = 0x62;
    break;
  default:
    return;
  }
  __assert_fail("source == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                ,__line,
                "void burst::management::manage(operation_t, const void *, void *) [T = burst::dynamic_tuple]"
               );
}

Assistant:

void manage (operation_t todo, const void * source, void * destination)
        {
            switch (todo)
            {
                case operation_t::copy:
                {
                    copy<T>(source, destination);
                    break;
                }
                case operation_t::move:
                {
                    move<T>(const_cast<void *>(source), destination);
                    break;
                }
                case operation_t::destroy:
                {
                    assert(source == nullptr);
                    destroy<T>(destination);
                    break;
                }
                case operation_t::size:
                {
                    assert(source == nullptr);
                    *static_cast<std::size_t *>(destination) = sizeof(T);
                    break;
                }
                case operation_t::type:
                {
                    assert(source == nullptr);
                    *static_cast<const std::type_info **>(destination) = std::addressof(typeid(T));
                    break;
                }
            }
        }